

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.c
# Opt level: O2

size_t strftime(char *__s,size_t __maxsize,char *__format,tm *__tp)

{
  ulong uVar1;
  div_t dVar2;
  size_t sVar3;
  div_t dVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  
  uVar1 = __maxsize - 2;
  uVar7 = 0;
switchD_00109d31_caseD_26:
  while( true ) {
    if (__maxsize < uVar7 || __maxsize - uVar7 == 0) {
      return 0;
    }
    cVar5 = *__format;
    if (cVar5 == '%') break;
    __s[uVar7] = cVar5;
    if (cVar5 == '\0') {
      return uVar7;
    }
    __format = __format + 1;
    uVar7 = uVar7 + 1;
  }
  pcVar9 = __format + 1;
  __format = __format + 2;
  switch(*pcVar9) {
  case '%':
    __s[uVar7] = '%';
    uVar7 = uVar7 + 1;
  default:
    goto switchD_00109d31_caseD_26;
  case 'A':
    if ((ulong)(uint)__tp->tm_wday < 7) {
      pcVar9 = _PDCLIB_lc_time->day_name_full[(uint)__tp->tm_wday];
    }
    else {
LAB_0010a010:
      pcVar9 = "?";
    }
    goto LAB_0010a0fb;
  case 'B':
    if (0xb < (ulong)(uint)__tp->tm_mon) goto LAB_0010a010;
    pcVar9 = _PDCLIB_lc_time->month_name_full[(uint)__tp->tm_mon];
    goto LAB_0010a0fb;
  case 'C':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = (__tp->tm_year + 0x76c) / 100;
    break;
  case 'D':
    pcVar9 = "%m/%d/%y";
    goto LAB_0010a13f;
  case 'F':
    pcVar9 = "%Y-%m-%d";
    goto LAB_0010a13f;
  case 'G':
    if (__maxsize - 4 <= uVar7) {
      return 0;
    }
    dVar2.quot = week_calc((tm *)__tp,3);
    dVar2.rem = 0;
    for (uVar8 = 3; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      dVar2 = div(dVar2.quot,10);
      __s[uVar8 + uVar7] = (char)dVar2.rem + '0';
    }
    goto LAB_00109fe1;
  case 'H':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = __tp->tm_hour;
    break;
  case 'I':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = (__tp->tm_hour + 0xb) % 0xc + 1;
    break;
  case 'M':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = __tp->tm_min;
    break;
  case 'R':
    pcVar9 = "%H:%M";
    goto LAB_0010a13f;
  case 'S':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = __tp->tm_sec;
    break;
  case 'T':
    pcVar9 = "%H:%M:%S";
    goto LAB_0010a13f;
  case 'U':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = 0;
    goto LAB_00109f94;
  case 'V':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = 2;
    goto LAB_00109f94;
  case 'W':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = 1;
LAB_00109f94:
    iVar6 = week_calc((tm *)__tp,iVar6);
    break;
  case 'X':
    pcVar9 = _PDCLIB_lc_time->time_format;
    goto LAB_0010a13f;
  case 'Y':
    if (__maxsize - 4 <= uVar7) {
      return 0;
    }
    dVar4.quot = __tp->tm_year + 0x76c;
    dVar4.rem = 0;
    for (uVar8 = 3; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      dVar4 = div(dVar4.quot,10);
      __s[uVar8 + uVar7] = (char)dVar4.rem + '0';
    }
LAB_00109fe1:
    uVar7 = uVar7 + 4;
    goto switchD_00109d31_caseD_26;
  case 'a':
    if (6 < (ulong)(uint)__tp->tm_wday) goto LAB_0010a010;
    pcVar9 = _PDCLIB_lc_time->day_name_abbr[(uint)__tp->tm_wday];
    goto LAB_0010a0fb;
  case 'b':
  case 'h':
    if (0xb < (ulong)(uint)__tp->tm_mon) goto LAB_0010a010;
    pcVar9 = _PDCLIB_lc_time->month_name_abbr[(uint)__tp->tm_mon];
    goto LAB_0010a0fb;
  case 'c':
    pcVar9 = _PDCLIB_lc_time->date_time_format;
    goto LAB_0010a13f;
  case 'd':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = __tp->tm_mday;
    break;
  case 'e':
    if (uVar1 <= uVar7) {
      return 0;
    }
    dVar4 = div(__tp->tm_mday,10);
    cVar5 = ' ';
    if (0 < dVar4.quot) {
      cVar5 = (char)dVar4.quot + '0';
    }
    __s[uVar7] = cVar5;
    __s[uVar7 + 1] = (char)dVar4.rem + '0';
    uVar7 = uVar7 + 2;
    goto switchD_00109d31_caseD_26;
  case 'g':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = week_calc((tm *)__tp,3);
    goto LAB_00109e91;
  case 'j':
    if (__maxsize - 3 <= uVar7) {
      return 0;
    }
    dVar4 = div(__tp->tm_yday + 1,100);
    __s[uVar7] = (char)dVar4.quot + '0';
    __s[uVar7 + 1] = (char)(dVar4.rem / 10) + '0';
    __s[uVar7 + 2] = (char)(dVar4.rem % 10) + '0';
    uVar7 = uVar7 + 3;
    goto switchD_00109d31_caseD_26;
  case 'm':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = __tp->tm_mon + 1;
    break;
  case 'n':
    __s[uVar7] = '\n';
    uVar7 = uVar7 + 1;
    goto switchD_00109d31_caseD_26;
  case 'p':
    pcVar9 = _PDCLIB_lc_time->am_pm[0xb < __tp->tm_hour];
LAB_0010a0fb:
    sVar3 = strlen(pcVar9);
    if (__maxsize - sVar3 <= uVar7) {
      return 0;
    }
    strcpy(__s + uVar7,pcVar9);
    uVar7 = uVar7 + sVar3;
    goto switchD_00109d31_caseD_26;
  case 'r':
    pcVar9 = _PDCLIB_lc_time->time_format_12h;
    goto LAB_0010a13f;
  case 't':
    __s[uVar7] = '\t';
    uVar7 = uVar7 + 1;
    goto switchD_00109d31_caseD_26;
  case 'u':
    cVar5 = '7';
    if (__tp->tm_wday != 0) {
      cVar5 = (char)__tp->tm_wday + '0';
    }
    __s[uVar7] = cVar5;
    uVar7 = uVar7 + 1;
    goto switchD_00109d31_caseD_26;
  case 'w':
    __s[uVar7] = (char)__tp->tm_wday + '0';
    uVar7 = uVar7 + 1;
    goto switchD_00109d31_caseD_26;
  case 'x':
    pcVar9 = _PDCLIB_lc_time->date_format;
LAB_0010a13f:
    sVar3 = strftime(__s + uVar7,__maxsize - uVar7,pcVar9,__tp);
    uVar7 = uVar7 + sVar3;
    if (sVar3 == 0) {
      return 0;
    }
    goto switchD_00109d31_caseD_26;
  case 'y':
    if (uVar1 <= uVar7) {
      return 0;
    }
    iVar6 = __tp->tm_year;
LAB_00109e91:
    iVar6 = iVar6 % 100;
  }
  dVar4 = div(iVar6,10);
  __s[uVar7] = (char)dVar4.quot + '0';
  __s[uVar7 + 1] = (char)dVar4.rem + '0';
  uVar7 = uVar7 + 2;
  goto switchD_00109d31_caseD_26;
}

Assistant:

size_t strftime( char * _PDCLIB_restrict s, size_t maxsize, const char * _PDCLIB_restrict format, const struct tm * _PDCLIB_restrict timeptr )
{
    size_t rc = 0;

    while ( rc < maxsize )
    {
        if ( *format != '%' )
        {
            if ( ( s[rc] = *format++ ) == '\0' )
            {
                return rc;
            }
            else
            {
                ++rc;
            }
        }
        else
        {
            /* char flag = 0; */
            switch ( *++format )
            {
                case 'E':
                case 'O':
                    /* flag = *format++; */
                    break;

                default:
                    /* EMPTY */
                    break;
            }

            switch ( *format++ )
            {
                case 'a':
                {
                    /* tm_wday abbreviated */
                    SPRINTSTR( _PDCLIB_lc_time->day_name_abbr, timeptr->tm_wday, 6 );
                    break;
                }

                case 'A':
                {
                    /* tm_wday full */
                    SPRINTSTR( _PDCLIB_lc_time->day_name_full, timeptr->tm_wday, 6 );
                    break;
                }

                case 'b':
                case 'h':
                {
                    /* tm_mon abbreviated */
                    SPRINTSTR( _PDCLIB_lc_time->month_name_abbr, timeptr->tm_mon, 11 );
                    break;
                }

                case 'B':
                {
                    /* tm_mon full */
                    SPRINTSTR( _PDCLIB_lc_time->month_name_full, timeptr->tm_mon, 11 );
                    break;
                }

                case 'c':
                {
                    /* locale's date / time representation, %a %b %e %T %Y for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->date_time_format );
                    break;
                }

                case 'C':
                {
                    /* tm_year divided by 100, truncated to decimal (00-99) */
                    /* 'E' for base year (period) in locale's alternative representation */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t period = div( ( ( timeptr->tm_year + 1900 ) / 100 ), 10 );
                        s[rc++] = '0' + period.quot;
                        s[rc++] = '0' + period.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'd':
                {
                    /* tm_mday as decimal (01-31) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t day = div( timeptr->tm_mday, 10 );
                        s[rc++] = '0' + day.quot;
                        s[rc++] = '0' + day.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'D':
                {
                    /* %m/%d/%y */
                    SPRINTREC( "%m/%d/%y" );
                    break;
                }

                case 'e':
                {
                    /* tm_mday as decimal ( 1-31) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t day = div( timeptr->tm_mday, 10 );
                        s[rc++] = ( day.quot > 0 ) ? '0' + day.quot : ' ';
                        s[rc++] = '0' + day.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'F':
                {
                    /* %Y-%m-%d */
                    SPRINTREC( "%Y-%m-%d" );
                    break;
                }

                case 'g':
                {
                    /* last 2 digits of the week-based year as decimal (00-99) */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t year = div( week_calc( timeptr, E_ISO_YEAR ) % 100, 10 );
                        s[rc++] = '0' + year.quot;
                        s[rc++] = '0' + year.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'G':
                {
                    /* week-based year as decimal (e.g. 1997) */
                    if ( rc < ( maxsize - 4 ) )
                    {
                        int year = week_calc( timeptr, E_ISO_YEAR );
                        int i;

                        for ( i = 3; i >= 0; --i )
                        {
                            div_t digit = div( year, 10 );
                            s[ rc + i ] = '0' + digit.rem;
                            year = digit.quot;
                        }

                        rc += 4;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'H':
                {
                    /* tm_hour as 24h decimal (00-23) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t hour = div( timeptr->tm_hour, 10 );
                        s[rc++] = '0' + hour.quot;
                        s[rc++] = '0' + hour.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'I':
                {
                    /* tm_hour as 12h decimal (01-12) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t hour = div( ( timeptr->tm_hour + 11 ) % 12 + 1, 10 );
                        s[rc++] = '0' + hour.quot;
                        s[rc++] = '0' + hour.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'j':
                {
                    /* tm_yday as decimal (001-366) */
                    if ( rc < ( maxsize - 3 ) )
                    {
                        div_t yday = div( timeptr->tm_yday + 1, 100 );
                        s[rc++] = '0' + yday.quot;
                        s[rc++] = '0' + yday.rem / 10;
                        s[rc++] = '0' + yday.rem % 10;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'm':
                {
                    /* tm_mon as decimal (01-12) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t mon = div( timeptr->tm_mon + 1, 10 );
                        s[rc++] = '0' + mon.quot;
                        s[rc++] = '0' + mon.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'M':
                {
                    /* tm_min as decimal (00-59) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t min = div( timeptr->tm_min, 10 );
                        s[rc++] = '0' + min.quot;
                        s[rc++] = '0' + min.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'n':
                {
                    /* newline */
                    s[rc++] = '\n';
                    break;
                }

                case 'p':
                {
                    /* tm_hour locale's AM/PM designations */
                    SPRINTSTR( _PDCLIB_lc_time->am_pm, timeptr->tm_hour > 11, 1 );
                    break;
                }

                case 'r':
                {
                    /* tm_hour / tm_min / tm_sec as locale's 12-hour clock time, %I:%M:%S %p for C locale */
                    SPRINTREC( _PDCLIB_lc_time->time_format_12h );
                    break;
                }

                case 'R':
                {
                    /* %H:%M */
                    SPRINTREC( "%H:%M" );
                    break;
                }

                case 'S':
                {
                    /* tm_sec as decimal (00-60) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t sec = div( timeptr->tm_sec, 10 );
                        s[rc++] = '0' + sec.quot;
                        s[rc++] = '0' + sec.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 't':
                {
                    /* tabulator */
                    s[rc++] = '\t';
                    break;
                }

                case 'T':
                {
                    /* %H:%M:%S */
                    SPRINTREC( "%H:%M:%S" );
                    break;
                }

                case 'u':
                {
                    /* tm_wday as decimal (1-7) with Monday == 1 */
                    /* 'O' for locale's alternative numeric symbols */
                    s[rc++] = ( timeptr->tm_wday == 0 ) ? '7' : '0' + timeptr->tm_wday;
                    break;
                }

                case 'U':
                {
                    /* week number of the year (first Sunday as the first day of week 1) as decimal (00-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_SUNDAY ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'V':
                {
                    /* ISO week number as decimal (01-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_ISO_WEEK ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'w':
                {
                    /* tm_wday as decimal number (0-6) with Sunday == 0 */
                    /* 'O' for locale's alternative numeric symbols */
                    s[rc++] = '0' + timeptr->tm_wday;
                    break;
                }

                case 'W':
                {
                    /* week number of the year (first Monday as the first day of week 1) as decimal (00-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_MONDAY ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'x':
                {
                    /* locale's date representation, %m/%d/%y for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->date_format );
                    break;
                }

                case 'X':
                {
                    /* locale's time representation, %T for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->time_format );
                    break;
                }

                case 'y':
                {
                    /* last 2 digits of tm_year as decimal (00-99) */
                    /* 'E' for offset from %EC (year only) in locale's alternative representation */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t year = div( ( timeptr->tm_year % 100 ), 10 );
                        s[rc++] = '0' + year.quot;
                        s[rc++] = '0' + year.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'Y':
                {
                    /* tm_year as decimal (e.g. 1997) */
                    /* 'E' for locale's alternative representation */
                    if ( rc < ( maxsize - 4 ) )
                    {
                        int year = timeptr->tm_year + 1900;
                        int i;

                        for ( i = 3; i >= 0; --i )
                        {
                            div_t digit = div( year, 10 );
                            s[ rc + i ] = '0' + digit.rem;
                            year = digit.quot;
                        }

                        rc += 4;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'z':
                {
                    /* tm_isdst / UTC offset in ISO8601 format (e.g. -0430 meaning 4 hours 30 minutes behind Greenwich), or no characters */
                    /* TODO: 'z' */
                    break;
                }

                case 'Z':
                {
                    /* tm_isdst / locale's time zone name or abbreviation, or no characters */
                    /* TODO: 'Z' */
                    break;
                }

                case '%':
                {
                    /* '%' character */
                    s[rc++] = '%';
                    break;
                }
            }
        }
    }

    return 0;
}